

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::XmlUnitTestResultPrinter::OutputXmlTestProperties
               (ostream *stream,TestResult *result)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  char *pcVar4;
  allocator<char> local_111;
  string local_110;
  string local_f0;
  allocator<char> local_c9;
  string local_c8;
  string local_a8;
  TestProperty *local_88;
  TestProperty *property;
  undefined4 local_78;
  int i;
  string local_70 [8];
  string kProperty;
  allocator<char> local_39;
  string local_38 [8];
  string kProperties;
  TestResult *result_local;
  ostream *stream_local;
  
  kProperties.field_2._8_8_ = result;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_38,"properties",&local_39);
  std::allocator<char>::~allocator(&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_70,"property",(allocator<char> *)((long)&i + 3));
  std::allocator<char>::~allocator((allocator<char> *)((long)&i + 3));
  iVar1 = TestResult::test_property_count((TestResult *)kProperties.field_2._8_8_);
  if (iVar1 < 1) {
    local_78 = 1;
  }
  else {
    poVar3 = std::operator<<(stream,"      <");
    poVar3 = std::operator<<(poVar3,local_38);
    std::operator<<(poVar3,">\n");
    property._4_4_ = 0;
    while( true ) {
      iVar1 = property._4_4_;
      iVar2 = TestResult::test_property_count((TestResult *)kProperties.field_2._8_8_);
      if (iVar2 <= iVar1) break;
      local_88 = TestResult::GetTestProperty((TestResult *)kProperties.field_2._8_8_,property._4_4_)
      ;
      poVar3 = std::operator<<(stream,"        <");
      std::operator<<(poVar3,local_70);
      poVar3 = std::operator<<(stream," name=\"");
      pcVar4 = TestProperty::key(local_88);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,pcVar4,&local_c9);
      EscapeXmlAttribute(&local_a8,&local_c8);
      poVar3 = std::operator<<(poVar3,(string *)&local_a8);
      std::operator<<(poVar3,"\"");
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::allocator<char>::~allocator(&local_c9);
      poVar3 = std::operator<<(stream," value=\"");
      pcVar4 = TestProperty::value(local_88);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,pcVar4,&local_111);
      EscapeXmlAttribute(&local_f0,&local_110);
      poVar3 = std::operator<<(poVar3,(string *)&local_f0);
      std::operator<<(poVar3,"\"");
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_110);
      std::allocator<char>::~allocator(&local_111);
      std::operator<<(stream,"/>\n");
      property._4_4_ = property._4_4_ + 1;
    }
    poVar3 = std::operator<<(stream,"      </");
    poVar3 = std::operator<<(poVar3,local_38);
    std::operator<<(poVar3,">\n");
    local_78 = 0;
  }
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void XmlUnitTestResultPrinter::OutputXmlTestProperties(
    std::ostream* stream, const TestResult& result) {
  const std::string kProperties = "properties";
  const std::string kProperty = "property";

  if (result.test_property_count() <= 0) {
    return;
  }

  *stream << "      <" << kProperties << ">\n";
  for (int i = 0; i < result.test_property_count(); ++i) {
    const TestProperty& property = result.GetTestProperty(i);
    *stream << "        <" << kProperty;
    *stream << " name=\"" << EscapeXmlAttribute(property.key()) << "\"";
    *stream << " value=\"" << EscapeXmlAttribute(property.value()) << "\"";
    *stream << "/>\n";
  }
  *stream << "      </" << kProperties << ">\n";
}